

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

bool setLogLevel(string *loglevel)

{
  undefined8 uVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  bVar2 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
  if (bVar2) {
    softLogLevel = 3;
  }
  else {
    bVar2 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
    if (bVar2) {
      softLogLevel = 4;
    }
    else {
      bVar2 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
      if (bVar2) {
        softLogLevel = 6;
      }
      else {
        bVar2 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
        if (!bVar2) {
          uVar1 = std::__cxx11::string::c_str();
          softHSMLog(3,"setLogLevel",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/log.cpp"
                     ,0x41,"Unknown value (%s) for log.level in configuration",uVar1);
          return false;
        }
        softLogLevel = 7;
      }
    }
  }
  return true;
}

Assistant:

bool setLogLevel(const std::string &loglevel)
{
	if (loglevel == "ERROR")
	{
		softLogLevel = LOG_ERR;
	}
	else if (loglevel == "WARNING")
	{
		softLogLevel = LOG_WARNING;
	}
	else if (loglevel == "INFO")
	{
		softLogLevel = LOG_INFO;
	}
	else if (loglevel == "DEBUG")
	{
		softLogLevel = LOG_DEBUG;
	}
	else
	{
		ERROR_MSG("Unknown value (%s) for log.level in configuration", loglevel.c_str());
		return false;
	}

	return true;
}